

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_value(cJSON *item,int depth,int fmt,printbuffer *p)

{
  undefined1 uVar1;
  char *pcVar2;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  uVar1 = (undefined1)item->type;
  if (p == (printbuffer *)0x0) {
    switch(uVar1) {
    case 0:
      pcVar2 = (char *)(*cJSON_malloc)(6);
      break;
    case 1:
      pcVar2 = (char *)(*cJSON_malloc)(5);
      goto LAB_001027ef;
    case 2:
      pcVar2 = (char *)(*cJSON_malloc)(5);
      goto LAB_001027cb;
    case 3:
      p = (printbuffer *)0x0;
      goto LAB_001027de;
    case 4:
      pcVar2 = item->valuestring;
      p = (printbuffer *)0x0;
      goto LAB_001027ba;
    case 5:
      p = (printbuffer *)0x0;
      goto switchD_0010273a_caseD_5;
    case 6:
      p = (printbuffer *)0x0;
      goto switchD_0010273a_caseD_6;
    default:
      goto switchD_0010273a_default;
    }
  }
  else {
    switch(uVar1) {
    case 0:
      pcVar2 = ensure(p,6);
      break;
    case 1:
      pcVar2 = ensure(p,5);
LAB_001027ef:
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      builtin_strncpy(pcVar2,"true",5);
      return pcVar2;
    case 2:
      pcVar2 = ensure(p,5);
LAB_001027cb:
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      builtin_strncpy(pcVar2,"null",5);
      return pcVar2;
    case 3:
LAB_001027de:
      pcVar2 = print_number(item,p);
      return pcVar2;
    case 4:
      pcVar2 = item->valuestring;
LAB_001027ba:
      pcVar2 = print_string_ptr(pcVar2,p);
      return pcVar2;
    case 5:
switchD_0010273a_caseD_5:
      pcVar2 = print_array(item,depth,fmt,p);
      return pcVar2;
    case 6:
switchD_0010273a_caseD_6:
      pcVar2 = print_object(item,depth,fmt,p);
      return pcVar2;
    default:
      goto switchD_0010273a_default;
    }
  }
  if (pcVar2 != (char *)0x0) {
    builtin_strncpy(pcVar2,"false",6);
    return pcVar2;
  }
switchD_0010273a_default:
  return (char *)0x0;
}

Assistant:

static char *print_value(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char *out=0;
	if (!item) return 0;
	if (p)
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	{out=ensure(p,5);	if (out) strcpy(out,"null");	break;}
			case cJSON_False:	{out=ensure(p,6);	if (out) strcpy(out,"false");	break;}
			case cJSON_True:	{out=ensure(p,5);	if (out) strcpy(out,"true");	break;}
			case cJSON_Number:	out=print_number(item,p);break;
			case cJSON_String:	out=print_string(item,p);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,p);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,p);break;
		}
	}
	else
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	out=cJSON_strdup("null");	break;
			case cJSON_False:	out=cJSON_strdup("false");break;
			case cJSON_True:	out=cJSON_strdup("true"); break;
			case cJSON_Number:	out=print_number(item,0);break;
			case cJSON_String:	out=print_string(item,0);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,0);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,0);break;
		}
	}
	return out;
}